

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O1

void __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::apply
          (iSWAP<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_16_2_357f297d f;
  int *local_50 [2];
  long local_40;
  anon_class_16_2_357f297d local_38;
  
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (local_50,this);
  *local_50[0] = *local_50[0] + offset;
  local_50[0][1] = local_50[0][1] + offset;
  local_38.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_38.lambda._M_value = 0xbf80000000000000;
  }
  else {
    local_38.lambda._M_value = 0x3f80000000000000;
  }
  apply4bc<qclab::qgates::lambda_iSWAP<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_50[0],local_50[0][1],&local_38);
  if (local_50[0] != (int *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  return;
}

Assistant:

void iSWAP< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_iSWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }